

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_any_construct_any_object.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  obj *poVar2;
  any local_38;
  any b;
  any a;
  obj local_18;
  obj o;
  
  o.str._4_4_ = 0;
  obj::obj(&local_18,"test");
  type::any::any<obj>(&b,&local_18);
  type::any::any(&local_38,&b);
  poVar2 = type::any::as<obj>(&local_38);
  iVar1 = strcmp(poVar2->str,"test");
  if (iVar1 == 0) {
    o.str._4_4_ = 0;
  }
  else {
    o.str._4_4_ = -1;
  }
  type::any::~any(&local_38);
  type::any::~any(&b);
  return o.str._4_4_;
}

Assistant:

int main() {
  try {
    obj o("test");
    type::any a(o);
    type::any b(a);
    if(strcmp(b.as<obj>().str, "test") == 0) {
      return 0;
    }
    return -1;
  }
  catch(...) {
    return -1;
  }
}